

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseStructBody(Parser *this,Structure *s)

{
  string_view memberName;
  bool bVar1;
  undefined1 uVar2;
  string *psVar3;
  Structure *pSVar4;
  string *args;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  bool local_1d2;
  string local_1b8;
  Type local_198;
  undefined1 local_180 [71];
  byte local_139;
  Type local_138;
  byte local_119;
  undefined1 local_118 [64];
  undefined1 local_d8 [8];
  Type structType;
  undefined1 local_78 [8];
  string name;
  undefined1 local_48 [8];
  Type type;
  CodeLocation typeLocation;
  Structure *s_local;
  Parser *this_local;
  
  while( true ) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x54ceac);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    CodeLocation::CodeLocation
              ((CodeLocation *)&type.structure,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    readValueType((Type *)local_48,this);
    readGeneralIdentifier_abi_cxx11_((string *)local_78,this);
    expectSemicolon(this);
    memberName = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
    bVar1 = Structure::hasMemberWithName(s,memberName);
    if (bVar1) {
      Errors::nameInUse<std::__cxx11::string&>
                ((CompileMessage *)&structType.structure,(Errors *)local_78,args_00);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&structType.structure);
      CompileMessage::~CompileMessage((CompileMessage *)&structType.structure);
    }
    Type::createStruct((Type *)local_d8,s);
    bVar1 = Type::isEqual((Type *)local_48,(Type *)local_d8,0);
    if (bVar1) break;
    uVar2 = Type::isStruct((Type *)local_48);
    local_119 = 0;
    local_139 = 0;
    local_1d2 = false;
    if ((bool)uVar2) {
      Type::getStruct((Type *)local_118);
      local_119 = 1;
      pSVar4 = RefCountedPtr<soul::Structure>::operator->
                         ((RefCountedPtr<soul::Structure> *)local_118);
      Type::createStruct(&local_138,s);
      local_139 = 1;
      local_1d2 = Structure::containsMemberOfType(pSVar4,&local_138,true);
    }
    if ((local_139 & 1) != 0) {
      Type::~Type(&local_138);
    }
    if ((local_119 & 1) != 0) {
      RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_118);
    }
    if (local_1d2 != false) {
      psVar3 = Structure::getName_abi_cxx11_(s);
      Type::getStruct((Type *)local_180);
      pSVar4 = RefCountedPtr<soul::Structure>::operator->
                         ((RefCountedPtr<soul::Structure> *)local_180);
      args = Structure::getName_abi_cxx11_(pSVar4);
      Errors::typesReferToEachOther<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((CompileMessage *)(local_180 + 8),(Errors *)psVar3,args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(in_register_00000009,uVar2));
      CodeLocation::throwError((CodeLocation *)&type.structure,(CompileMessage *)(local_180 + 8));
    }
    Type::Type(&local_198,(Type *)local_48);
    std::__cxx11::string::string((string *)&local_1b8,(string *)local_78);
    Structure::addMember(s,&local_198,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    Type::~Type(&local_198);
    Type::~Type((Type *)local_d8);
    std::__cxx11::string::~string((string *)local_78);
    Type::~Type((Type *)local_48);
    CodeLocation::~CodeLocation((CodeLocation *)&type.structure);
  }
  psVar3 = Structure::getName_abi_cxx11_(s);
  Errors::typeContainsItself<std::__cxx11::string_const&>
            ((CompileMessage *)(local_118 + 8),(Errors *)psVar3,args_01);
  CodeLocation::throwError((CodeLocation *)&type.structure,(CompileMessage *)(local_118 + 8));
}

Assistant:

void parseStructBody (Structure& s)
    {
        while (! matchIf (HEARTOperator::closeBrace))
        {
            auto typeLocation = location;

            auto type = readValueType();
            auto name = readGeneralIdentifier();
            expectSemicolon();

            if (s.hasMemberWithName (name))
                throwError (Errors::nameInUse (name));

            auto structType = Type::createStruct (s);

            if (type.isEqual (structType, Type::failOnAllDifferences))
                typeLocation.throwError (Errors::typeContainsItself (s.getName()));

            if (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (s), true))
                typeLocation.throwError (Errors::typesReferToEachOther (s.getName(), type.getStruct()->getName()));

            s.addMember (type, name);
        }
    }